

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vault.c
# Opt level: O1

boolean clear_fcorr(monst *grd,boolean forceshow)

{
  char cVar1;
  char cVar2;
  long lVar3;
  boolean bVar4;
  int iVar5;
  int iVar6;
  monst *mtmp;
  int iVar7;
  int x;
  char *pcVar8;
  
  bVar4 = on_level((d_level *)((long)&grd[1].data + 4),&u.uz);
  if (bVar4 != '\0') {
    iVar6 = *(int *)&grd->field_0x74;
    iVar5 = *(int *)&grd[1].nmon;
    if (iVar6 < iVar5) {
      do {
        lVar3 = (long)iVar6 * 3;
        if (0 < grd->mhp) {
          iVar7 = iVar5 - iVar6;
          pcVar8 = (char *)((long)grd[1].mtrack + lVar3 + -0x33);
          do {
            if ((pcVar8[-1] == u.ux) && (*pcVar8 == u.uy)) goto LAB_0027dc9e;
            pcVar8 = pcVar8 + 3;
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
        }
        if (((ulong)grd[1].data & 0x100000000000000) != 0) {
          forceshow = '\x01';
        }
LAB_0027dc9e:
        cVar1 = *(char *)((long)grd[1].mtrack + lVar3 + -0x34);
        x = (int)cVar1;
        cVar2 = *(char *)((long)grd[1].mtrack + lVar3 + -0x33);
        iVar7 = (int)cVar2;
        if (((((0 < grd->mhp) && (u.ux == cVar1)) && (u.uy == cVar2)) ||
            ((forceshow == '\0' && ((viz_array[iVar7][x] & 1U) != 0)))) ||
           (((uball != (obj *)0x0 && ((uball->where != '\x03' && (uball->ox == cVar1)))) &&
            (uball->oy == cVar2)))) {
          return '\0';
        }
        mtmp = level->monsters[x][iVar7];
        if (mtmp == (monst *)0x0) {
          mtmp = (monst *)0x0;
        }
        else if ((mtmp->field_0x61 & 2) != 0) {
          mtmp = (monst *)0x0;
        }
        if (mtmp != (monst *)0x0) {
          if ((mtmp->field_0x63 & 8) != 0) {
            return '\0';
          }
          iVar5 = iVar5 - iVar6;
          pcVar8 = (char *)((long)grd[1].mtrack + lVar3 + -0x33);
          do {
            if ((pcVar8[-1] == u.ux) && (*pcVar8 == u.uy)) goto LAB_0027dd98;
            pcVar8 = pcVar8 + 3;
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
          if (mtmp->mtame != '\0') {
            yelp(mtmp);
          }
          rloc(level,mtmp,'\0');
        }
LAB_0027dd98:
        level->locations[x][iVar7].typ = *(schar *)((long)grd[1].mtrack + lVar3 + -0x32);
        map_location(x,iVar7,1);
        if (level->locations[x][iVar7].typ < '\x17') {
          block_point(x,iVar7);
        }
        iVar5 = *(int *)&grd[1].nmon;
        iVar6 = *(int *)&grd->field_0x74 + 1;
        *(int *)&grd->field_0x74 = iVar6;
      } while (iVar6 < iVar5);
    }
    if ((grd->mhp < 1) &&
       (pline("The corridor disappears."), level->locations[u.ux][u.uy].typ < '\x11')) {
      pline("You are encased in rock.");
    }
  }
  return '\x01';
}

Assistant:

static boolean clear_fcorr(struct monst *grd, boolean forceshow)
{
	int fcx, fcy, fcbeg;
	struct monst *mtmp;

	if (!on_level(&(EGD(grd)->gdlevel), &u.uz)) return TRUE;

	while ((fcbeg = EGD(grd)->fcbeg) < EGD(grd)->fcend) {
		fcx = EGD(grd)->fakecorr[fcbeg].fx;
		fcy = EGD(grd)->fakecorr[fcbeg].fy;
		if ((grd->mhp <= 0 || !in_fcorridor(grd, u.ux, u.uy)) &&
				   EGD(grd)->gddone)
			forceshow = TRUE;
		if ((u.ux == fcx && u.uy == fcy && grd->mhp > 0)
			|| (!forceshow && couldsee(fcx,fcy))
			|| (Punished && !carried(uball)
				&& uball->ox == fcx && uball->oy == fcy))
			return FALSE;

		if ((mtmp = m_at(level, fcx,fcy)) != 0) {
			if (mtmp->isgd) return FALSE;
			else if (!in_fcorridor(grd, u.ux, u.uy)) {
			    if (mtmp->mtame) yelp(mtmp);
			    rloc(level, mtmp, FALSE);
			}
		}
		level->locations[fcx][fcy].typ = EGD(grd)->fakecorr[fcbeg].ftyp;
		map_location(fcx, fcy, 1);	/* bypass vision */
		if (!ACCESSIBLE(level->locations[fcx][fcy].typ)) block_point(fcx,fcy);
		EGD(grd)->fcbeg++;
	}
	if (grd->mhp <= 0) {
	    pline("The corridor disappears.");
	    if (IS_ROCK(level->locations[u.ux][u.uy].typ)) pline("You are encased in rock.");
	}
	return TRUE;
}